

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

int allphone_search_finish(ps_search_t *search)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar1 = *(uint *)&search[1].d2p;
  uVar2 = *(uint *)((long)&search[1].hyp_str + 4);
  *(uint *)&search[1].hyp_str = *(int *)&search[1].hyp_str + uVar1;
  uVar3 = *(uint *)&(search[1].last_link)->best_prev;
  if ((int)uVar1 < 1) {
    uVar4 = *(uint *)&search[1].dag;
    uVar9 = 0;
    uVar7 = 0;
    uVar8 = 0;
  }
  else {
    uVar7 = (long)(int)uVar2 / (long)(int)uVar1 & 0xffffffff;
    uVar4 = *(uint *)&search[1].dag;
    uVar9 = (long)(int)uVar4 / (long)(int)uVar1 & 0xffffffff;
    uVar8 = (long)(int)uVar3 / (long)(int)uVar1 & 0xffffffff;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x357,"%d frames, %d HMMs (%d/fr), %d senones (%d/fr), %d history entries (%d/fr)\n",
          (ulong)uVar1,(ulong)uVar2,uVar7,(ulong)uVar4,uVar9,(ulong)uVar3,uVar8);
  allphone_backtrace((allphone_search_t *)search,*(int *)&search[1].d2p + -1,(int32 *)0x0);
  ptmr_stop((ptmr_t *)&search[1].start_wid);
  iVar5 = search->acmod->output_frame;
  if (0 < iVar5) {
    lVar6 = ps_config_int(search->config,"frate");
    dVar10 = (double)(iVar5 + 1) / (double)lVar6;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x364,"allphone %.2f CPU %.3f xRT\n",*(double *)&search[1].finish_wid,
            *(double *)&search[1].finish_wid / dVar10);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x366,"allphone %.2f wall %.3f xRT\n",search[2].vt,(double)search[2].vt / dVar10);
  }
  return 0;
}

Assistant:

int
allphone_search_finish(ps_search_t * search)
{
    allphone_search_t *allphs;
    int32 cf, n_hist;

    allphs = (allphone_search_t *) search;

    allphs->n_tot_frame += allphs->frame;
    n_hist = blkarray_list_n_valid(allphs->history);
    E_INFO
        ("%d frames, %d HMMs (%d/fr), %d senones (%d/fr), %d history entries (%d/fr)\n",
         allphs->frame, allphs->n_hmm_eval,
         (allphs->frame > 0) ? allphs->n_hmm_eval / allphs->frame : 0,
         allphs->n_sen_eval,
         (allphs->frame > 0) ? allphs->n_sen_eval / allphs->frame : 0,
         n_hist, (allphs->frame > 0) ? n_hist / allphs->frame : 0);

    /* Now backtrace. */
    allphone_backtrace(allphs, allphs->frame - 1, NULL);

    /* Print out some statistics. */
    ptmr_stop(&allphs->perf);
    /* This is the number of frames processed. */
    cf = ps_search_acmod(allphs)->output_frame;
    if (cf > 0) {
        double n_speech = (double) (cf + 1)
            / ps_config_int(ps_search_config(allphs), "frate");
        E_INFO("allphone %.2f CPU %.3f xRT\n",
               allphs->perf.t_cpu, allphs->perf.t_cpu / n_speech);
        E_INFO("allphone %.2f wall %.3f xRT\n",
               allphs->perf.t_elapsed, allphs->perf.t_elapsed / n_speech);
    }


    return 0;
}